

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor.h
# Opt level: O1

void hiberlite::access::
     destroy<hiberlite::ExtractModel,std::pair<std::__cxx11::string,std::__cxx11::string>>
               (ExtractModel *param_1,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *c)

{
  pointer pcVar1;
  
  if (c != (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)0x0) {
    pcVar1 = (c->second)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(c->second).field_2) {
      operator_delete(pcVar1);
    }
    pcVar1 = (c->first)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 != &(c->first).field_2) {
      operator_delete(pcVar1);
    }
    operator_delete(c);
    return;
  }
  return;
}

Assistant:

static void destroy(A& /*a*/, C* c)
	{
		delete c;
	}